

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::RegrSState,double,double,duckdb::RegrSYYOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,RegrSState *state,
               idx_t count,SelectionVector *asel,SelectionVector *bsel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  long lVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  uint64_t uVar14;
  undefined1 auVar13 [16];
  double dVar15;
  undefined1 auVar16 [16];
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar14 = (state->var_pop).count;
      dVar12 = (state->var_pop).mean;
      dVar11 = (state->var_pop).dsquared;
      iVar7 = 0;
      do {
        iVar9 = iVar7;
        if (asel->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)asel->sel_vector[iVar7];
        }
        lVar1 = uVar14 + 1 + iVar7;
        dVar15 = adata[iVar9] - dVar12;
        auVar16._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar16._0_8_ = lVar1;
        auVar16._12_4_ = 0x45300000;
        dVar12 = dVar12 + dVar15 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
        dVar11 = dVar11 + (adata[iVar9] - dVar12) * dVar15;
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
      state->count = state->count + count;
      (state->var_pop).count = uVar14 + count;
      (state->var_pop).mean = dVar12;
      (state->var_pop).dsquared = dVar11;
    }
  }
  else if (count != 0) {
    psVar3 = asel->sel_vector;
    psVar4 = bsel->sel_vector;
    puVar5 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar8 = 0;
    do {
      uVar10 = uVar8;
      if (psVar3 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar3[uVar8];
      }
      uVar6 = uVar8;
      if (psVar4 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar4[uVar8];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
         && ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))))
      {
        uVar14 = (state->var_pop).count + 1;
        state->count = state->count + 1;
        (state->var_pop).count = uVar14;
        dVar12 = adata[uVar10];
        dVar11 = (state->var_pop).mean;
        dVar15 = dVar12 - dVar11;
        auVar13._8_4_ = (int)(uVar14 >> 0x20);
        auVar13._0_8_ = uVar14;
        auVar13._12_4_ = 0x45300000;
        dVar11 = dVar15 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0)) + dVar11;
        (state->var_pop).mean = dVar11;
        (state->var_pop).dsquared = (dVar12 - dVar11) * dVar15 + (state->var_pop).dsquared;
      }
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}